

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v8::detail::
         write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>
                   (appender out,decimal_fp<float> *fp,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  float_specs fVar1;
  bool bVar2;
  type tVar3;
  int iVar4;
  appender *paVar5;
  appender it;
  bool local_259;
  int local_238;
  int local_234;
  char local_211;
  int local_210;
  char local_209;
  anon_class_48_6_d9b5e731 local_208;
  float_specs local_1d8;
  bool local_1cd;
  int local_1cc;
  undefined1 auStack_1c8 [3];
  bool pointy;
  int num_zeros;
  sign_t *local_1c0;
  sign_t *local_1b8;
  int *local_1b0;
  char *local_1a8;
  digit_grouping<char> *local_1a0;
  int *local_198;
  float_specs local_190;
  decimal_fp<float> *local_188;
  undefined1 local_180 [8];
  digit_grouping<char> grouping_1;
  undefined1 auStack_150 [4];
  int num_zeros_3;
  sign_t *local_148;
  sign_t *local_140;
  basic_format_specs<char> *local_138;
  digit_grouping<char> *local_130;
  locale_ref *local_128;
  char *local_120;
  char *local_118;
  float_specs local_110;
  decimal_fp<float> *local_f8;
  undefined1 local_f0 [8];
  digit_grouping<char> grouping;
  int num_zeros_2;
  int exp;
  undefined1 local_9c [8];
  anon_class_28_7_94dcc806 write;
  char exp_char;
  int exp_digits;
  int abs_output_exp;
  int num_zeros_1;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  int output_exp;
  char local_51;
  size_t sStack_50;
  char decimal_point;
  size_t size;
  sign_t local_40;
  sign_t sign;
  int significand_size;
  significand_type significand;
  basic_format_specs<char> *specs_local;
  decimal_fp<float> *fp_local;
  locale_ref loc_local;
  float_specs fspecs_local;
  appender out_local;
  
  sign = fp->significand;
  _significand_size = specs;
  specs_local = (basic_format_specs<char> *)fp;
  fp_local = (decimal_fp<float> *)loc.locale_;
  loc_local.locale_ = (void *)fspecs;
  fspecs_local = (float_specs)
                 out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  local_40 = get_significand_size<float>(fp);
  size._4_4_ = loc_local.locale_._4_4_ >> 8 & 0xff;
  tVar3 = to_unsigned<int>(local_40);
  sStack_50 = (size_t)(tVar3 + (size._4_4_ != none));
  if ((loc_local.locale_._4_4_ >> 0x11 & 1) == 0) {
    local_209 = '.';
  }
  else {
    stack0xffffffffffffffa0 = fp_local;
    local_209 = decimal_point<char>((locale_ref)fp_local);
  }
  local_51 = local_209;
  use_exp_format.fspecs.precision = specs_local->precision + local_40 + -1;
  _abs_output_exp = (float_specs)loc_local.locale_;
  use_exp_format.fspecs._4_4_ = use_exp_format.fspecs.precision;
  bVar2 = write_float<fmt::v8::appender,_fmt::v8::detail::dragonbox::decimal_fp<float>,_char>::
          anon_class_12_2_f0c9b3c6::operator()((anon_class_12_2_f0c9b3c6 *)&abs_output_exp);
  if (bVar2) {
    exp_digits = 0;
    if ((loc_local.locale_._4_4_ >> 0x14 & 1) == 0) {
      if (local_40 == minus) {
        local_51 = '\0';
      }
    }
    else {
      exp_digits = (int)loc_local.locale_ - local_40;
      if (exp_digits < 0) {
        exp_digits = 0;
      }
      tVar3 = to_unsigned<int>(exp_digits);
      sStack_50 = tVar3 + sStack_50;
    }
    if ((int)use_exp_format.fspecs._4_4_ < 0) {
      local_210 = -use_exp_format.fspecs._4_4_;
    }
    else {
      local_210 = use_exp_format.fspecs._4_4_;
    }
    write.output_exp = 2;
    if ((99 < local_210) && (write.output_exp = 3, 999 < local_210)) {
      write.output_exp = 4;
    }
    tVar3 = to_unsigned<int>((local_51 != '\0') + 2 + write.output_exp);
    fVar1 = fspecs_local;
    sStack_50 = tVar3 + sStack_50;
    local_211 = 'E';
    if (((ulong)loc_local.locale_ & 0x1000000000000) == 0) {
      local_211 = 'e';
    }
    write._23_1_ = local_211;
    local_9c._0_4_ = size._4_4_;
    local_9c._4_4_ = sign;
    write.sign = local_40;
    write.significand._0_1_ = local_51;
    write.significand_size = exp_digits;
    write.decimal_point = local_211;
    write.num_zeros = use_exp_format.fspecs._4_4_;
    if (_significand_size->width < 1) {
      paVar5 = reserve<fmt::v8::appender>((appender *)&fspecs_local,sStack_50);
      it = write_float<fmt::v8::appender,_fmt::v8::detail::dragonbox::decimal_fp<float>,_char>::
           anon_class_28_7_94dcc806::operator()
                     ((anon_class_28_7_94dcc806 *)local_9c,
                      (iterator)
                      (paVar5->super_back_insert_iterator<fmt::v8::detail::buffer<char>_>).container
                     );
      out_local = base_iterator<fmt::v8::appender>((appender)fVar1,it);
    }
    else {
      out_local = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_&>
                            ((appender)fspecs_local,_significand_size,sStack_50,
                             (anon_class_28_7_94dcc806 *)local_9c);
    }
  }
  else {
    grouping.sep_._36_4_ = specs_local->precision + local_40;
    if (specs_local->precision < 0) {
      if ((int)grouping.sep_._36_4_ < 1) {
        local_1cc = -grouping.sep_._36_4_;
        if (((local_40 == none) && (-1 < (int)loc_local.locale_)) &&
           ((int)loc_local.locale_ < local_1cc)) {
          local_1cc = (int)loc_local.locale_;
        }
        local_259 = true;
        if ((local_1cc == 0) && (local_259 = true, local_40 == none)) {
          local_259 = (bool)((byte)(loc_local.locale_._4_4_ >> 0x14) & 1);
        }
        local_1cd = local_259;
        tVar3 = to_unsigned<int>(local_1cc);
        sStack_50 = ((local_259 != false) + 1 + tVar3) + sStack_50;
        local_1d8 = fspecs_local;
        local_208.sign = (sign_t *)((long)&size + 4);
        local_208.pointy = &local_1cd;
        local_208.decimal_point = &local_51;
        local_208.num_zeros = &local_1cc;
        local_208.significand = &sign;
        local_208.significand_size = (int *)&local_40;
        out_local = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_>
                              ((appender)fspecs_local,_significand_size,sStack_50,&local_208);
      }
      else {
        if ((loc_local.locale_._4_4_ >> 0x14 & 1) == 0) {
          local_234 = 0;
        }
        else {
          local_234 = (int)loc_local.locale_ - local_40;
        }
        grouping_1.sep_._36_4_ = local_234;
        if (local_234 < 1) {
          local_238 = 0;
        }
        else {
          local_238 = local_234;
        }
        tVar3 = to_unsigned<int>(local_238);
        sStack_50 = sStack_50 + (tVar3 + 1);
        local_188 = fp_local;
        digit_grouping<char>::digit_grouping
                  ((digit_grouping<char> *)local_180,(locale_ref)fp_local,
                   (bool)((byte)(loc_local.locale_._4_4_ >> 0x11) & 1));
        iVar4 = digit_grouping<char>::count_separators((digit_grouping<char> *)local_180,local_40);
        tVar3 = to_unsigned<int>(iVar4);
        sStack_50 = sStack_50 + tVar3;
        local_190 = fspecs_local;
        _auStack_1c8 = (sign_t *)((long)&size + 4);
        local_1c0 = &sign;
        local_1b8 = &local_40;
        local_1b0 = (int *)&grouping.sep_.field_0x24;
        local_1a8 = &local_51;
        local_1a0 = (digit_grouping<char> *)local_180;
        local_198 = (int *)&grouping_1.sep_.field_0x24;
        out_local = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_>
                              ((appender)fspecs_local,_significand_size,sStack_50,
                               (anon_class_56_7_aadf885c *)auStack_1c8);
        digit_grouping<char>::~digit_grouping((digit_grouping<char> *)local_180);
      }
    }
    else {
      tVar3 = to_unsigned<int>(specs_local->precision);
      sStack_50 = tVar3 + sStack_50;
      grouping.sep_._32_4_ = (int)loc_local.locale_ - grouping.sep_._36_4_;
      if ((loc_local.locale_._4_4_ >> 0x14 & 1) != 0) {
        if (((int)grouping.sep_._32_4_ < 1) && ((char)((ulong)loc_local.locale_ >> 0x20) != '\x02'))
        {
          grouping.sep_.thousands_sep = '\x01';
          grouping.sep_._33_3_ = 0;
        }
        if (0 < (int)grouping.sep_._32_4_) {
          tVar3 = to_unsigned<int>(grouping.sep_._32_4_);
          sStack_50 = (tVar3 + 1) + sStack_50;
        }
      }
      local_f8 = fp_local;
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)local_f0,(locale_ref)fp_local,
                 (bool)((byte)(loc_local.locale_._4_4_ >> 0x11) & 1));
      iVar4 = digit_grouping<char>::count_separators((digit_grouping<char> *)local_f0,local_40);
      tVar3 = to_unsigned<int>(iVar4);
      sStack_50 = sStack_50 + tVar3;
      local_110 = fspecs_local;
      _auStack_150 = (sign_t *)((long)&size + 4);
      local_148 = &sign;
      local_140 = &local_40;
      local_138 = specs_local;
      local_130 = (digit_grouping<char> *)local_f0;
      local_128 = &loc_local;
      local_120 = &local_51;
      local_118 = &grouping.sep_.thousands_sep;
      out_local = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_>
                            ((appender)fspecs_local,_significand_size,sStack_50,
                             (anon_class_64_8_b997adb5 *)auStack_150);
      digit_grouping<char>::~digit_grouping((digit_grouping<char> *)local_f0);
    }
  }
  return (appender)
         out_local.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
}

Assistant:

auto write_float(OutputIt out, const DecimalFP& fp,
                 const basic_format_specs<Char>& specs, float_specs fspecs,
                 locale_ref loc) -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = digit_grouping<Char>(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = digit_grouping<Char>(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}